

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

Path * Pathie::Path::get_xdg_dir
                 (Path *__return_storage_ptr__,string *envvarname,string *defaultpath)

{
  pointer pcVar1;
  char *__s;
  size_t sVar2;
  string env_nstr;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  utf8_to_filename(&local_38,envvarname);
  __s = getenv(local_38._M_dataplus._M_p);
  if (__s == (char *)0x0) {
    home();
    pcVar1 = (defaultpath->_M_dataplus)._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + defaultpath->_M_string_length);
    join(__return_storage_ptr__,(Path *)&local_98,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_0010c07e;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,__s,__s + sVar2);
    filename_to_utf8(&local_58,&local_98);
    Path(__return_storage_ptr__,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_0010c07e;
  }
  operator_delete(local_98._M_dataplus._M_p);
LAB_0010c07e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::get_xdg_dir(const std::string& envvarname, const std::string& defaultpath)
{
  std::string env_nstr = utf8_to_filename(envvarname); // environment is encoded the same as the filenames
  char* env_value = getenv(env_nstr.c_str());
  if (env_value)
    return Path(filename_to_utf8(env_value));

  return Path::home().join(defaultpath);
}